

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

RPCHelpMan * getprioritisedtransactions(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff808;
  allocator<RPCResult> *this;
  RPCResult *this_00;
  anon_class_1_0_00000001 *in_stack_fffffffffffff810;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff840;
  allocator<char> *in_stack_fffffffffffff848;
  char *in_stack_fffffffffffff850;
  undefined7 in_stack_fffffffffffff858;
  undefined1 in_stack_fffffffffffff85f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff860;
  string *in_stack_fffffffffffff868;
  undefined1 skip_type_check;
  RPCHelpMan *pRVar2;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff870;
  RPCHelpMan *pRVar3;
  string *in_stack_fffffffffffff878;
  RPCResult *in_stack_fffffffffffff880;
  RPCResult *in_stack_fffffffffffff888;
  string *psVar4;
  RPCResult *in_stack_fffffffffffff890;
  RPCHelpMan *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  undefined6 in_stack_fffffffffffff968;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 local_640 [35];
  allocator<char> local_61d;
  allocator<char> local_61c;
  allocator<char> local_61b [3];
  pointer local_618;
  pointer pRStack_610;
  pointer local_608;
  allocator<char> local_5fa;
  allocator<char> local_5f9;
  _Alloc_hider local_5f8;
  size_type sStack_5f0;
  undefined1 local_5e8 [15];
  allocator<char> local_5d9;
  _Alloc_hider local_5d8;
  size_type sStack_5d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8;
  allocator<char> local_5b2;
  allocator<char> local_5b1 [31];
  allocator<char> local_592;
  allocator<char> local_591;
  RPCMethodImpl *in_stack_fffffffffffffa70;
  allocator<char> local_572;
  allocator<char> local_571 [25];
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  allocator<char> local_532;
  vector<RPCArg,_std::allocator<RPCArg>_> local_531 [18];
  RPCHelpMan local_370;
  string local_260 [4];
  RPCHelpMan local_1d8;
  undefined1 local_110 [264];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args = local_531;
  results = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  local_558 = 0;
  uStack_550 = 0;
  local_548 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  local_5d8._M_p = (pointer)0x0;
  sStack_5d0 = 0;
  local_5c8._M_allocated_capacity = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff808);
  RPCResult::RPCResult
            (in_stack_fffffffffffff890,(Type)((ulong)in_stack_fffffffffffff888 >> 0x20),
             (string *)in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff870
             ,SUB81((ulong)in_stack_fffffffffffff868 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  local_5f8._M_p = (pointer)0x0;
  sStack_5f0 = 0;
  local_5e8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff808);
  RPCResult::RPCResult
            (in_stack_fffffffffffff890,(Type)((ulong)in_stack_fffffffffffff888 >> 0x20),
             (string *)in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff870
             ,SUB81((ulong)in_stack_fffffffffffff868 >> 0x38,0));
  psVar4 = local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  local_618 = (pointer)0x0;
  pRStack_610 = (pointer)0x0;
  local_608 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff808);
  this = (allocator<RPCResult> *)((ulong)in_stack_fffffffffffff808 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff888,(Type)((ulong)in_stack_fffffffffffff880 >> 0x20),
             in_stack_fffffffffffff878,SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0),
             in_stack_fffffffffffff868,in_stack_fffffffffffff860,(bool)in_stack_fffffffffffff85f);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff868 >> 0x38);
  uVar6 = 0;
  pRVar3 = &local_370;
  std::allocator<RPCResult>::allocator(this);
  __l._M_len._0_7_ = in_stack_fffffffffffff858;
  __l._M_array = (iterator)in_stack_fffffffffffff850;
  __l._M_len._7_1_ = in_stack_fffffffffffff85f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff848,__l,
             (allocator_type *)in_stack_fffffffffffff840);
  RPCResult::RPCResult
            (in_stack_fffffffffffff890,(Type)((ulong)in_stack_fffffffffffff888 >> 0x20),
             (string *)in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff870
             ,(bool)skip_type_check);
  uVar5 = 0;
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff858;
  __l_00._M_array = (iterator)in_stack_fffffffffffff850;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff85f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff848,__l_00,
             (allocator_type *)in_stack_fffffffffffff840);
  RPCResult::RPCResult
            (in_stack_fffffffffffff890,(Type)((ulong)in_stack_fffffffffffff888 >> 0x20),
             (string *)in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff870
             ,(bool)skip_type_check);
  RPCResults::RPCResults((RPCResults *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  HelpExampleCli(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),in_stack_fffffffffffff850
             ,in_stack_fffffffffffff848);
  HelpExampleRpc(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::operator+(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x60f4ac);
  this_00 = (RPCResult *)local_640;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getprioritisedtransactions()::__0,void>
            (in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  RPCHelpMan::RPCHelpMan
            (pRVar3,psVar4,(string *)CONCAT17(uVar6,CONCAT16(uVar5,in_stack_fffffffffffff968)),args,
             (RPCResults *)results,(RPCExamples *)in_RDI,in_stack_fffffffffffffa70);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)(local_640 + 0x22));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_61d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_61c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_61b);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult(this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff818);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  psVar4 = &local_1d8.m_description;
  puVar1 = local_110;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult(this_00);
  } while ((string *)puVar1 != psVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff818);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  pRVar3 = &local_370;
  pRVar2 = &local_1d8;
  do {
    pRVar2 = (RPCHelpMan *)&pRVar2[-1].m_fun.super__Function_base._M_manager;
    RPCResult::~RPCResult(this_00);
  } while (pRVar2 != pRVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff818);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_5fa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_5f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff818);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)(local_5e8 + 0xe));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_5d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff818);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_5b2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_5b1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_592);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_572);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_571);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff818);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_532);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_531);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return results;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getprioritisedtransactions()
{
    return RPCHelpMan{"getprioritisedtransactions",
        "Returns a map of all user-created (see prioritisetransaction) fee deltas by txid, and whether the tx is present in mempool.",
        {},
        RPCResult{
            RPCResult::Type::OBJ_DYN, "", "prioritisation keyed by txid",
            {
                {RPCResult::Type::OBJ, "<transactionid>", "", {
                    {RPCResult::Type::NUM, "fee_delta", "transaction fee delta in satoshis"},
                    {RPCResult::Type::BOOL, "in_mempool", "whether this transaction is currently in mempool"},
                    {RPCResult::Type::NUM, "modified_fee", /*optional=*/true, "modified fee in satoshis. Only returned if in_mempool=true"},
                }}
            },
        },
        RPCExamples{
            HelpExampleCli("getprioritisedtransactions", "")
            + HelpExampleRpc("getprioritisedtransactions", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            NodeContext& node = EnsureAnyNodeContext(request.context);
            CTxMemPool& mempool = EnsureMemPool(node);
            UniValue rpc_result{UniValue::VOBJ};
            for (const auto& delta_info : mempool.GetPrioritisedTransactions()) {
                UniValue result_inner{UniValue::VOBJ};
                result_inner.pushKV("fee_delta", delta_info.delta);
                result_inner.pushKV("in_mempool", delta_info.in_mempool);
                if (delta_info.in_mempool) {
                    result_inner.pushKV("modified_fee", *delta_info.modified_fee);
                }
                rpc_result.pushKV(delta_info.txid.GetHex(), std::move(result_inner));
            }
            return rpc_result;
        },
    };
}